

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<SubArray,_Macro>_>::rehash
          (Data<QHashPrivate::Node<SubArray,_Macro>_> *this,size_t sizeHint)

{
  uchar *puVar1;
  ulong uVar2;
  Span *pSVar3;
  Entry *pEVar4;
  Data *pDVar5;
  char *pcVar6;
  qsizetype qVar7;
  Data *pDVar8;
  Symbol *pSVar9;
  uchar uVar10;
  Node<SubArray,_Macro> *pNVar11;
  ulong uVar12;
  ulong uVar13;
  Span *pSVar14;
  size_t numBuckets;
  size_t index;
  long lVar15;
  long lVar16;
  R RVar17;
  Bucket BVar18;
  
  if (sizeHint == 0) {
    sizeHint = this->size;
  }
  numBuckets = 0x80;
  if ((0x40 < sizeHint) && (numBuckets = 0xffffffffffffffff, sizeHint >> 0x3e == 0)) {
    lVar15 = 0x3f;
    if (sizeHint != 0) {
      for (; sizeHint >> lVar15 == 0; lVar15 = lVar15 + -1) {
      }
    }
    numBuckets = 1L << (0x41 - ((byte)lVar15 ^ 0x3f) & 0x3f);
  }
  uVar2 = this->numBuckets;
  pSVar3 = this->spans;
  RVar17 = allocateSpans(numBuckets);
  this->spans = (Span *)RVar17.spans;
  this->numBuckets = numBuckets;
  if (0x7f < uVar2) {
    uVar12 = 0;
    pSVar14 = pSVar3;
    do {
      lVar15 = 0;
      do {
        if (pSVar14->offsets[lVar15] != 0xff) {
          pEVar4 = pSVar3[uVar12].entries;
          uVar13 = (ulong)((uint)pSVar14->offsets[lVar15] * 0x60);
          BVar18 = findBucket<SubArray>(this,(SubArray *)((pEVar4->storage).data + uVar13));
          pNVar11 = Span<QHashPrivate::Node<SubArray,_Macro>_>::insert(BVar18.span,BVar18.index);
          pDVar5 = *(Data **)((pEVar4->storage).data + uVar13);
          puVar1 = (pEVar4->storage).data + uVar13;
          puVar1[0] = '\0';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          puVar1[4] = '\0';
          puVar1[5] = '\0';
          puVar1[6] = '\0';
          puVar1[7] = '\0';
          (pNVar11->key).array.d.d = pDVar5;
          pcVar6 = *(char **)((pEVar4->storage).data + uVar13 + 8);
          puVar1 = (pEVar4->storage).data + uVar13 + 8;
          puVar1[0] = '\0';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          puVar1[4] = '\0';
          puVar1[5] = '\0';
          puVar1[6] = '\0';
          puVar1[7] = '\0';
          (pNVar11->key).array.d.ptr = pcVar6;
          qVar7 = *(qsizetype *)((pEVar4->storage).data + uVar13 + 0x10);
          puVar1 = (pEVar4->storage).data + uVar13 + 0x10;
          puVar1[0] = '\0';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          puVar1[4] = '\0';
          puVar1[5] = '\0';
          puVar1[6] = '\0';
          puVar1[7] = '\0';
          (pNVar11->key).array.d.size = qVar7;
          puVar1 = (pEVar4->storage).data + uVar13 + 0x18;
          qVar7 = *(qsizetype *)(puVar1 + 8);
          (pNVar11->key).from = *(qsizetype *)puVar1;
          (pNVar11->key).len = qVar7;
          puVar1 = (pEVar4->storage).data + uVar13 + 0x28;
          uVar10 = puVar1[1];
          (pNVar11->value).isFunction = (bool)puVar1[0];
          (pNVar11->value).isVariadic = (bool)uVar10;
          pDVar8 = *(Data **)((pEVar4->storage).data + uVar13 + 0x30);
          puVar1 = (pEVar4->storage).data + uVar13 + 0x30;
          puVar1[0] = '\0';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          puVar1[4] = '\0';
          puVar1[5] = '\0';
          puVar1[6] = '\0';
          puVar1[7] = '\0';
          (pNVar11->value).arguments.d.d = pDVar8;
          pSVar9 = *(Symbol **)((pEVar4->storage).data + uVar13 + 0x38);
          puVar1 = (pEVar4->storage).data + uVar13 + 0x38;
          puVar1[0] = '\0';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          puVar1[4] = '\0';
          puVar1[5] = '\0';
          puVar1[6] = '\0';
          puVar1[7] = '\0';
          (pNVar11->value).arguments.d.ptr = pSVar9;
          qVar7 = *(qsizetype *)((pEVar4->storage).data + uVar13 + 0x40);
          puVar1 = (pEVar4->storage).data + uVar13 + 0x40;
          puVar1[0] = '\0';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          puVar1[4] = '\0';
          puVar1[5] = '\0';
          puVar1[6] = '\0';
          puVar1[7] = '\0';
          (pNVar11->value).arguments.d.size = qVar7;
          pDVar8 = *(Data **)((pEVar4->storage).data + uVar13 + 0x48);
          puVar1 = (pEVar4->storage).data + uVar13 + 0x48;
          puVar1[0] = '\0';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          puVar1[4] = '\0';
          puVar1[5] = '\0';
          puVar1[6] = '\0';
          puVar1[7] = '\0';
          (pNVar11->value).symbols.d.d = pDVar8;
          pSVar9 = *(Symbol **)((pEVar4->storage).data + uVar13 + 0x50);
          puVar1 = (pEVar4->storage).data + uVar13 + 0x50;
          puVar1[0] = '\0';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          puVar1[4] = '\0';
          puVar1[5] = '\0';
          puVar1[6] = '\0';
          puVar1[7] = '\0';
          (pNVar11->value).symbols.d.ptr = pSVar9;
          qVar7 = *(qsizetype *)((pEVar4->storage).data + uVar13 + 0x58);
          puVar1 = (pEVar4->storage).data + uVar13 + 0x58;
          puVar1[0] = '\0';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          puVar1[4] = '\0';
          puVar1[5] = '\0';
          puVar1[6] = '\0';
          puVar1[7] = '\0';
          (pNVar11->value).symbols.d.size = qVar7;
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 != 0x80);
      Span<QHashPrivate::Node<SubArray,_Macro>_>::freeData(pSVar3 + uVar12);
      uVar12 = uVar12 + 1;
      pSVar14 = pSVar14 + 1;
    } while (uVar12 != uVar2 >> 7);
  }
  if (pSVar3 != (Span *)0x0) {
    lVar15 = *(long *)&pSVar3[-1].allocated;
    if (lVar15 != 0) {
      lVar16 = lVar15 * 0x90;
      do {
        Span<QHashPrivate::Node<SubArray,_Macro>_>::freeData
                  ((Span<QHashPrivate::Node<SubArray,_Macro>_> *)(pSVar3[-1].offsets + lVar16));
        lVar16 = lVar16 + -0x90;
      } while (lVar16 != 0);
    }
    operator_delete__(&pSVar3[-1].allocated,lVar15 * 0x90 + 8);
    return;
  }
  return;
}

Assistant:

void rehash(size_t sizeHint = 0)
    {
        if (sizeHint == 0)
            sizeHint = size;
        size_t newBucketCount = GrowthPolicy::bucketsForCapacity(sizeHint);

        Span *oldSpans = spans;
        size_t oldBucketCount = numBuckets;
        spans = allocateSpans(newBucketCount).spans;
        numBuckets = newBucketCount;
        size_t oldNSpans = oldBucketCount >> SpanConstants::SpanShift;

        for (size_t s = 0; s < oldNSpans; ++s) {
            Span &span = oldSpans[s];
            for (size_t index = 0; index < SpanConstants::NEntries; ++index) {
                if (!span.hasNode(index))
                    continue;
                Node &n = span.at(index);
                auto it = findBucket(n.key);
                Q_ASSERT(it.isUnused());
                Node *newNode = it.insert();
                new (newNode) Node(std::move(n));
            }
            span.freeData();
        }
        delete[] oldSpans;
    }